

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-impl-test.cc
# Opt level: O0

void test_construct_from_double<true>(void)

{
  bool bVar1;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  fp v;
  AssertHelper *in_stack_ffffffffffffff60;
  AssertionResult *this;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  char *in_stack_ffffffffffffff70;
  char *expected_expression;
  int line;
  AssertionResult *this_00;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  Type type;
  fp *in_stack_ffffffffffffff90;
  AssertionResult local_58 [3];
  Message *message;
  AssertHelper *in_stack_ffffffffffffffe0;
  char local_10 [16];
  
  expected_expression = local_10;
  fmt::v5::internal::fp::fp<double>
            (in_stack_ffffffffffffff90,
             (double)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  message = (Message *)0x13ae147ae147ae;
  this_00 = (AssertionResult *)&stack0xffffffffffffffe0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            (expected_expression,in_stack_ffffffffffffff70,
             (unsigned_long *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
             (unsigned_long *)in_stack_ffffffffffffff60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  type = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff8c);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff70 =
         testing::AssertionResult::failure_message((AssertionResult *)0x10e79b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffff90,type,&this_00->success_,
               (int)((ulong)expected_expression >> 0x20),in_stack_ffffffffffffff70);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffe0,message);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff60);
    testing::Message::~Message((Message *)0x10e7e9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e82c);
  this = local_58;
  testing::internal::EqHelper<false>::Compare<int,int>
            (expected_expression,in_stack_ffffffffffffff70,
             (int *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),(int *)this);
  line = (int)((ulong)expected_expression >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff90);
    testing::AssertionResult::failure_message((AssertionResult *)0x10e8b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffff90,type,&this_00->success_,line,
               in_stack_ffffffffffffff70);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffe0,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this);
    testing::Message::~Message((Message *)0x10e904);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e944);
  return;
}

Assistant:

void test_construct_from_double<true>() {
  auto v = fp(1.23);
  EXPECT_EQ(v.f, 0x13ae147ae147aeu);
  EXPECT_EQ(v.e, -52);
}